

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

void __thiscall
S2Polygon::InsertLoop(S2Polygon *this,S2Loop *new_loop,S2Loop *parent,LoopMap *loop_map)

{
  undefined8 *puVar1;
  S2Loop *this_00;
  bool bVar2;
  vector<S2Loop*,std::allocator<S2Loop*>> *this_01;
  vector<S2Loop*,std::allocator<S2Loop*>> *this_02;
  S2Loop **ppSVar3;
  iterator iVar4;
  vector<S2Loop_*,_std::allocator<S2Loop_*>_> *__range2;
  int iVar6;
  undefined8 *puVar7;
  void *__src;
  ulong uVar8;
  S2Loop *child;
  S2Loop *local_48;
  S2Loop *local_40;
  S2Loop *local_38;
  void *pvVar5;
  
  local_48 = new_loop;
  this_00 = parent;
  do {
    local_38 = this_00;
    this_01 = (vector<S2Loop*,std::allocator<S2Loop*>> *)
              std::
              map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
              ::operator[](loop_map,&local_38);
    puVar7 = *(undefined8 **)this_01;
    puVar1 = *(undefined8 **)(this_01 + 8);
    while( true ) {
      if (puVar7 == puVar1) {
        this_02 = (vector<S2Loop*,std::allocator<S2Loop*>> *)
                  std::
                  map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
                  ::operator[](loop_map,&local_48);
        ppSVar3 = *(S2Loop ***)this_01;
        iVar4._M_current = *(S2Loop ***)(this_01 + 8);
        if (iVar4._M_current != ppSVar3) {
          uVar8 = 0;
          iVar6 = 0;
          do {
            local_40 = ppSVar3[uVar8];
            bVar2 = S2Loop::ContainsNested(local_48,local_40);
            if (bVar2) {
              iVar4._M_current = *(S2Loop ***)(this_02 + 8);
              if (iVar4._M_current == *(S2Loop ***)(this_02 + 0x10)) {
                std::vector<S2Loop*,std::allocator<S2Loop*>>::_M_realloc_insert<S2Loop*const&>
                          (this_02,iVar4,&local_40);
              }
              else {
                *iVar4._M_current = local_40;
                *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
              }
              pvVar5 = *(void **)(this_01 + 8);
              __src = (void *)(*(long *)this_01 + uVar8 * 8 + 8);
              if (__src != pvVar5) {
                memmove((void *)(*(long *)this_01 + uVar8 * 8),__src,(long)pvVar5 - (long)__src);
                pvVar5 = *(void **)(this_01 + 8);
              }
              iVar4._M_current = (S2Loop **)((long)pvVar5 + -8);
              *(S2Loop ***)(this_01 + 8) = iVar4._M_current;
            }
            else {
              iVar6 = iVar6 + 1;
              iVar4._M_current = *(S2Loop ***)(this_01 + 8);
            }
            uVar8 = (ulong)iVar6;
            ppSVar3 = *(S2Loop ***)this_01;
          } while (uVar8 < (ulong)((long)iVar4._M_current - (long)ppSVar3 >> 3));
        }
        if (iVar4._M_current == *(S2Loop ***)(this_01 + 0x10)) {
          std::vector<S2Loop*,std::allocator<S2Loop*>>::_M_realloc_insert<S2Loop*const&>
                    (this_01,iVar4,&local_48);
        }
        else {
          *iVar4._M_current = local_48;
          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
        }
        return;
      }
      this_00 = (S2Loop *)*puVar7;
      bVar2 = S2Loop::ContainsNested(this_00,new_loop);
      if (bVar2) break;
      puVar7 = puVar7 + 1;
    }
  } while( true );
}

Assistant:

void S2Polygon::InsertLoop(S2Loop* new_loop, S2Loop* parent,
                           LoopMap* loop_map) {
  vector<S2Loop*>* children;
  for (bool done = false; !done; ) {
    children = &(*loop_map)[parent];
    done = true;
    for (S2Loop* child : *children) {
      if (child->ContainsNested(new_loop)) {
        parent = child;
        done = false;
        break;
      }
    }
  }

  // Some of the children of the parent loop may now be children of
  // the new loop.
  vector<S2Loop*>* new_children = &(*loop_map)[new_loop];
  for (int i = 0; i < children->size();) {
    S2Loop* child = (*children)[i];
    if (new_loop->ContainsNested(child)) {
      new_children->push_back(child);
      children->erase(children->begin() + i);
    } else {
      ++i;
    }
  }
  children->push_back(new_loop);
}